

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

TimeRepr * timerepr_from_usecs(TimeRepr *__return_storage_ptr__,int64_t usecs)

{
  long lVar1;
  TimeRepr *result;
  int64_t x;
  int64_t usecs_local;
  
  memset(__return_storage_ptr__,0,0x18);
  __return_storage_ptr__->days = (int32_t)(usecs / 86400000000);
  lVar1 = usecs + (long)__return_storage_ptr__->days * -86400000000;
  __return_storage_ptr__->hours = (int32_t)(lVar1 / 3600000000);
  lVar1 = lVar1 + (long)__return_storage_ptr__->hours * -3600000000;
  __return_storage_ptr__->minutes = (int32_t)(lVar1 / 60000000);
  lVar1 = lVar1 + (long)__return_storage_ptr__->minutes * -60000000;
  __return_storage_ptr__->seconds = (int32_t)(lVar1 / 1000000);
  lVar1 = lVar1 + (long)__return_storage_ptr__->seconds * -1000000;
  __return_storage_ptr__->milliseconds = (int32_t)(lVar1 / 1000);
  __return_storage_ptr__->microseconds = (int)lVar1 + __return_storage_ptr__->milliseconds * -1000;
  return __return_storage_ptr__;
}

Assistant:

TimeRepr timerepr_from_usecs(int64_t usecs) {
    TimeRepr result = {0};

    int64_t x = usecs;

    result.days = x / NUM_USECS_IN_A_DAY;
    x -= result.days * NUM_USECS_IN_A_DAY;

    result.hours = x / NUM_USECS_IN_AN_HOUR;
    x -= result.hours * NUM_USECS_IN_AN_HOUR;

    result.minutes = x / NUM_USECS_IN_A_MINUTE;
    x -= result.minutes * NUM_USECS_IN_A_MINUTE;

    result.seconds = x / NUM_USECS_IN_A_SEC;
    x -= result.seconds * NUM_USECS_IN_A_SEC;

    result.milliseconds = x / NUM_USECS_IN_A_MSEC;
    x -= result.milliseconds * NUM_USECS_IN_A_MSEC;

    result.microseconds = x;

    return result;
}